

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
::InnerMap::InsertUniqueInList
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  void *pvVar1;
  bool bVar2;
  Node *first;
  Node *node_local;
  size_type b_local;
  InnerMap *this_local;
  
  if ((this->table_[b] == (void *)0x0) || (bVar2 = ShouldInsertAfterHead(this,node), !bVar2)) {
    node->next = (Node *)this->table_[b];
    this->table_[b] = node;
    iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
    ::iterator_base(__return_storage_ptr__,node,this,b);
  }
  else {
    pvVar1 = this->table_[b];
    node->next = *(Node **)((long)pvVar1 + 0xb0);
    *(Node **)((long)pvVar1 + 0xb0) = node;
    iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
    ::iterator_base(__return_storage_ptr__,node,this,b);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInList(size_type b, Node* node) {
      if (table_[b] != nullptr && ShouldInsertAfterHead(node)) {
        Node* first = static_cast<Node*>(table_[b]);
        node->next = first->next;
        first->next = node;
        return iterator(node, this, b);
      }

      node->next = static_cast<Node*>(table_[b]);
      table_[b] = static_cast<void*>(node);
      return iterator(node, this, b);
    }